

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

QString * __thiscall
QUrl::toString(QString *__return_storage_ptr__,QUrl *this,FormattingOptions options)

{
  QChar *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QArrayData *data;
  char16_t *pcVar4;
  bool bVar5;
  QUrlPrivate *pQVar6;
  qsizetype qVar7;
  ushort *tableModifications;
  FormattingOptions options_00;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QStringView in;
  QStringView in_00;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar5 = isValid(this);
  local_58.context._0_8_ = (QArrayData *)CONCAT44(local_58.context.line,local_58.context.version);
  if (!bVar5) goto LAB_0025ce4a;
  if ((~options.i & 0x7f00000U) == 0) {
    local_58.context.version = 2;
    local_58.context.line = 0;
    local_58.context.file._0_2_ = L'\0';
    local_58.context.file._2_2_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning
              (&local_58,
               "QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
    options.i = options.i & 0xf80fffff;
  }
  pQVar6 = this->d;
  if (((((options.i & 0x220U) == 0x200) &&
       (((options.i & 0x40U) == 0 & (pQVar6->sectionIsPresent & 0x40) >> 6) == 0)) &&
      ((char)options.i < '\0' || -1 < (char)pQVar6->sectionIsPresent)) && ((pQVar6->flags & 1) != 0)
     ) {
    QUrlPrivate::toLocalFile((QString *)&local_58,pQVar6,(FormattingOptions)(options.i | 0x7f00000))
    ;
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)CONCAT44(local_58.context.line,local_58.context.version)
    ;
    (__return_storage_ptr__->d).ptr =
         (char16_t *)
         CONCAT44(local_58.context.file._4_4_,
                  CONCAT22(local_58.context.file._2_2_,(char16_t)local_58.context.file));
    local_58.context.file._0_2_ = (char16_t)pcVar4;
    local_58.context.file._2_2_ = (undefined2)((ulong)pcVar4 >> 0x10);
    local_58.context.file._4_4_ = (undefined4)((ulong)pcVar4 >> 0x20);
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size =
         CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
    local_58.context.function._0_4_ = (undefined4)qVar2;
    local_58.context.function._4_4_ = (undefined4)((ulong)qVar2 >> 0x20);
    local_58.context._0_8_ = data;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    goto LAB_0025ce4a;
  }
  local_58.context._0_8_ = (QArrayData *)CONCAT44(local_58.context.line,local_58.context.version);
  if (((options.i & 1U) == 0) &&
     (local_58.context._0_8_ =
           (QArrayData *)CONCAT44(local_58.context.line,local_58.context.version),
     (pQVar6->sectionIsPresent & 1) != 0)) {
    local_58.context._0_8_ = &pQVar6->scheme;
    local_58.context.file._0_2_ = L':';
    ::operator+=(__return_storage_ptr__,(QStringBuilder<QString_&,_char16_t> *)&local_58);
    pQVar6 = this->d;
  }
  bVar5 = QString::startsWith(&pQVar6->path,(QChar)0x2f,CaseSensitive);
  options_00.i = ((uint)options.i >> 1 & 0x1000000 | options.i & 0xfeffffffU) ^ 0x1000000;
  pQVar6 = this->d;
  if ((~options.i & 0x1eU) == 0) {
    if (pQVar6 != (QUrlPrivate *)0x0) {
LAB_0025cc69:
      if (bVar5 && (pQVar6->flags & 1) != 0) {
        str_00.m_data = "//";
        str_00.m_size = 2;
        QString::append(__return_storage_ptr__,str_00);
      }
    }
  }
  else {
    if ((pQVar6->sectionIsPresent & 0x1e) == 0) goto LAB_0025cc69;
    str.m_data = "//";
    str.m_size = 2;
    QString::append(__return_storage_ptr__,str);
    QUrlPrivate::appendAuthority(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
  if ((options.i & 0x20U) == 0) {
    QUrlPrivate::appendPath(this->d,__return_storage_ptr__,options_00,FullUrl);
  }
  if (((options.i & 0x40U) == 0) && ((this->d->sectionIsPresent & 0x40) != 0)) {
    QString::append(__return_storage_ptr__,(QChar)0x3f);
    pQVar1 = (QChar *)(this->d->query).d.ptr;
    qVar2 = (this->d->query).d.size;
    if ((uint)options_00.i < 0x10000) {
LAB_0025cd04:
      QString::append(__return_storage_ptr__,pQVar1,qVar2);
    }
    else {
      in.m_data = (storage_type_conflict *)pQVar1;
      in.m_size = qVar2;
      qVar7 = qt_urlRecode(__return_storage_ptr__,in,(ComponentFormattingOptions)options_00.i,
                           userNameInUrl + 6);
      if (qVar7 == 0) goto LAB_0025cd04;
    }
    if ((pQVar1 != (QChar *)0x0 && (__return_storage_ptr__->d).ptr == (char16_t *)0x0) &&
       ((pDVar3 = (__return_storage_ptr__->d).d, pDVar3 == (Data *)0x0 ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)))) {
      QString::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
    }
  }
  if (((char)(options.i & 0xfeffffffU) < '\0') || (-1 < (char)this->d->sectionIsPresent))
  goto LAB_0025ce4a;
  QString::append(__return_storage_ptr__,(QChar)0x23);
  pQVar1 = (QChar *)(this->d->fragment).d.ptr;
  qVar2 = (this->d->fragment).d.size;
  if ((uint)options_00.i < 0x10000) {
LAB_0025cdaf:
    QString::append(__return_storage_ptr__,pQVar1,qVar2);
  }
  else {
    tableModifications = (ushort *)0x0;
    if ((options.i & 0xc00000U) != 0) {
      tableModifications = userNameInUrl + 6;
    }
    in_00.m_data = (storage_type_conflict *)pQVar1;
    in_00.m_size = qVar2;
    qVar7 = qt_urlRecode(__return_storage_ptr__,in_00,(ComponentFormattingOptions)options_00.i,
                         tableModifications);
    if (qVar7 == 0) goto LAB_0025cdaf;
  }
  if ((pQVar1 != (QChar *)0x0 && (__return_storage_ptr__->d).ptr == (char16_t *)0x0) &&
     ((pDVar3 = (__return_storage_ptr__->d).d, pDVar3 == (Data *)0x0 ||
      (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)))) {
    QString::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
  }
LAB_0025ce4a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QUrl::toString(FormattingOptions options) const
{
    QString url;
    if (!isValid()) {
        // also catches isEmpty()
        return url;
    }
    if ((options & QUrl::FullyDecoded) == QUrl::FullyDecoded) {
        qWarning("QUrl: QUrl::FullyDecoded is not permitted when reconstructing the full URL");
        options &= ~QUrl::FullyDecoded;
        //options |= QUrl::PrettyDecoded; // no-op, value is 0
    }

    // return just the path if:
    //  - QUrl::PreferLocalFile is passed
    //  - QUrl::RemovePath isn't passed (rather stupid if the user did...)
    //  - there's no query or fragment to return
    //    that is, either they aren't present, or we're removing them
    //  - it's a local file
    if (options.testFlag(QUrl::PreferLocalFile) && !options.testFlag(QUrl::RemovePath)
            && (!d->hasQuery() || options.testFlag(QUrl::RemoveQuery))
            && (!d->hasFragment() || options.testFlag(QUrl::RemoveFragment))
            && isLocalFile()) {
        url = d->toLocalFile(options | QUrl::FullyDecoded);
        return url;
    }

    // for the full URL, we consider that the reserved characters are prettier if encoded
    if (options & DecodeReserved)
        options &= ~EncodeReserved;
    else
        options |= EncodeReserved;

    if (!(options & QUrl::RemoveScheme) && d->hasScheme())
        url += d->scheme + u':';

    bool pathIsAbsolute = d->path.startsWith(u'/');
    if (!((options & QUrl::RemoveAuthority) == QUrl::RemoveAuthority) && d->hasAuthority()) {
        url += "//"_L1;
        d->appendAuthority(url, options, QUrlPrivate::FullUrl);
    } else if (isLocalFile() && pathIsAbsolute) {
        // Comply with the XDG file URI spec, which requires triple slashes.
        url += "//"_L1;
    }

    if (!(options & QUrl::RemovePath))
        d->appendPath(url, options, QUrlPrivate::FullUrl);

    if (!(options & QUrl::RemoveQuery) && d->hasQuery()) {
        url += u'?';
        d->appendQuery(url, options, QUrlPrivate::FullUrl);
    }
    if (!(options & QUrl::RemoveFragment) && d->hasFragment()) {
        url += u'#';
        d->appendFragment(url, options, QUrlPrivate::FullUrl);
    }

    return url;
}